

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZString.cpp
# Opt level: O0

wstring * __thiscall
lzstring::LZString::DeCompressFromUTF16
          (wstring *__return_storage_ptr__,LZString *this,wstring *input)

{
  int length;
  ulong uVar1;
  anon_class_8_1_a81546ea local_48;
  GetNextCharFunc local_40;
  wstring *local_20;
  wstring *input_local;
  LZString *this_local;
  
  local_20 = input;
  input_local = (wstring *)this;
  this_local = (LZString *)__return_storage_ptr__;
  uVar1 = std::__cxx11::wstring::empty();
  if ((uVar1 & 1) == 0) {
    length = std::__cxx11::wstring::size();
    local_48.input = local_20;
    std::function<wchar_t(int)>::
    function<lzstring::LZString::DeCompressFromUTF16(std::__cxx11::wstring_const&)::__0,void>
              ((function<wchar_t(int)> *)&local_40,&local_48);
    DeCompress_abi_cxx11_(__return_storage_ptr__,this,length,0x4000,&local_40);
    std::function<wchar_t_(int)>::~function(&local_40);
  }
  else {
    std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring LZString::DeCompressFromUTF16(const std::wstring &input)
{
	if (input.empty())
		return std::wstring();

	return DeCompress(input.size(), 16384, [&input](int index) { return (wchar_t)(input[index] - 32); });
}